

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateDefaultConstructorCall
          (ExpressionContext *ctx,SynBase *source,TypeBase *type,ExprBase *pointer)

{
  IntrusiveList<TypeHandle> generics;
  Allocator *value;
  TypeBase *pTVar1;
  SynBase *pSVar2;
  bool bVar3;
  ExprDereference *this;
  ArrayView<FunctionValue> functions_00;
  bool local_3b9;
  IntrusiveList<TypeHandle> local_3b8;
  undefined1 local_3a8 [2] [12];
  undefined1 local_388 [8];
  SmallArray<FunctionValue,_32U> functions;
  ExprBase *constructor;
  InplaceStr local_58;
  TypeRef *local_48;
  TypeRef *typeRef;
  TypeUnsizedArray *arrType_1;
  TypeArray *arrType;
  ExprBase *pointer_local;
  TypeBase *type_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  arrType = (TypeArray *)pointer;
  pointer_local = (ExprBase *)type;
  type_local = (TypeBase *)source;
  source_local = (SynBase *)ctx;
  bVar3 = isType<TypeRef>(pointer->type);
  local_3b9 = true;
  if (!bVar3) {
    local_3b9 = isType<TypeUnsizedArray>((TypeBase *)(arrType->super_TypeBase).name.end);
  }
  if (local_3b9 != false) {
    bVar3 = isType<TypeArray>((TypeBase *)pointer_local);
    if ((bVar3) || (bVar3 = isType<TypeUnsizedArray>((TypeBase *)pointer_local), bVar3)) {
      arrType_1 = (TypeUnsizedArray *)getType<TypeArray>((TypeBase *)pointer_local);
      if (arrType_1 == (TypeUnsizedArray *)0x0) {
        typeRef = (TypeRef *)getType<TypeUnsizedArray>((TypeBase *)pointer_local);
        if ((TypeUnsizedArray *)typeRef != (TypeUnsizedArray *)0x0) {
          pointer_local = (ExprBase *)((TypeUnsizedArray *)typeRef)->subType;
        }
      }
      else {
        pointer_local = (ExprBase *)(arrType_1->super_TypeStruct).typeScope;
      }
      bVar3 = HasDefaultConstructor
                        ((ExpressionContext *)source_local,(SynBase *)type_local,
                         (TypeBase *)pointer_local);
      if (bVar3) {
        local_48 = getType<TypeRef>((TypeBase *)(arrType->super_TypeBase).name.end);
        pSVar2 = source_local;
        pTVar1 = type_local;
        if (local_48 == (TypeRef *)0x0) {
          InplaceStr::InplaceStr((InplaceStr *)&constructor,"__init_array");
          ctx_local = (ExpressionContext *)
                      CreateFunctionCall1((ExpressionContext *)pSVar2,(SynBase *)pTVar1,_constructor
                                          ,(ExprBase *)arrType,false,true,true);
        }
        else {
          InplaceStr::InplaceStr(&local_58,"__init_array");
          this = ExpressionContext::get<ExprDereference>((ExpressionContext *)source_local);
          ExprDereference::ExprDereference
                    (this,(SynBase *)type_local,local_48->subType,(ExprBase *)arrType);
          ctx_local = (ExpressionContext *)
                      CreateFunctionCall1((ExpressionContext *)pSVar2,(SynBase *)pTVar1,local_58,
                                          &this->super_ExprBase,false,true,true);
        }
      }
      else {
        ctx_local = (ExpressionContext *)0x0;
      }
    }
    else {
      functions.allocator =
           (Allocator *)
           CreateConstructorAccess
                     ((ExpressionContext *)source_local,(SynBase *)type_local,
                      (TypeBase *)pointer_local,true,(ExprBase *)arrType);
      if ((ExprBase *)functions.allocator == (ExprBase *)0x0) {
        ctx_local = (ExpressionContext *)0x0;
      }
      else {
        SmallArray<FunctionValue,_32U>::SmallArray
                  ((SmallArray<FunctionValue,_32U> *)local_388,
                   (Allocator *)source_local[0x229].begin);
        GetNodeFunctions((ExpressionContext *)source_local,(SynBase *)type_local,
                         (ExprBase *)functions.allocator,(SmallArray<FunctionValue,_32U> *)local_388
                        );
        pSVar2 = source_local;
        pTVar1 = type_local;
        value = functions.allocator;
        ArrayView<FunctionValue>::ArrayView<32u>
                  ((ArrayView<FunctionValue> *)local_3a8,(SmallArray<FunctionValue,_32U> *)local_388
                  );
        IntrusiveList<TypeHandle>::IntrusiveList(&local_3b8);
        generics.tail._0_4_ = (int)local_3b8.tail;
        generics.head = local_3b8.head;
        generics.tail._4_4_ = (int)((ulong)local_3b8.tail >> 0x20);
        functions_00._12_4_ = 0;
        functions_00.data = (FunctionValue *)local_3a8[0]._0_8_;
        functions_00.count = local_3a8[0]._8_4_;
        ctx_local = (ExpressionContext *)
                    CreateFunctionCallOverloaded
                              ((ExpressionContext *)pSVar2,(SynBase *)pTVar1,(ExprBase *)value,
                               functions_00,generics,(SynCallArgument *)0x0,false);
        SmallArray<FunctionValue,_32U>::~SmallArray((SmallArray<FunctionValue,_32U> *)local_388);
      }
    }
    return (ExprBase *)ctx_local;
  }
  __assert_fail("isType<TypeRef>(pointer->type) || isType<TypeUnsizedArray>(pointer->type)",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x2747,
                "ExprBase *CreateDefaultConstructorCall(ExpressionContext &, SynBase *, TypeBase *, ExprBase *)"
               );
}

Assistant:

ExprBase* CreateDefaultConstructorCall(ExpressionContext &ctx, SynBase *source, TypeBase *type, ExprBase *pointer)
{
	assert(isType<TypeRef>(pointer->type) || isType<TypeUnsizedArray>(pointer->type));

	if(isType<TypeArray>(type) || isType<TypeUnsizedArray>(type))
	{
		if(TypeArray *arrType = getType<TypeArray>(type))
			type = arrType->subType;
		else if(TypeUnsizedArray *arrType = getType<TypeUnsizedArray>(type))
			type = arrType->subType;

		if(HasDefaultConstructor(ctx, source, type))
		{
			if(TypeRef *typeRef = getType<TypeRef>(pointer->type))
				return CreateFunctionCall1(ctx, source, InplaceStr("__init_array"), new (ctx.get<ExprDereference>()) ExprDereference(source, typeRef->subType, pointer), false, true, true);

			return CreateFunctionCall1(ctx, source, InplaceStr("__init_array"), pointer, false, true, true);
		}

		return NULL;
	}

	if(ExprBase *constructor = CreateConstructorAccess(ctx, source, type, true, pointer))
	{
		// Collect a set of available functions
		SmallArray<FunctionValue, 32> functions(ctx.allocator);

		GetNodeFunctions(ctx, source, constructor, functions);

		return CreateFunctionCallOverloaded(ctx, source, constructor, functions, IntrusiveList<TypeHandle>(), NULL, false);
	}

	return NULL;
}